

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O1

void __thiscall tvm::runtime::GraphRuntime::SetupStorage(GraphRuntime *this)

{
  uint uVar1;
  DLDeviceType DVar2;
  pointer pbVar3;
  pointer pcVar4;
  pointer piVar5;
  DLContext *pDVar6;
  DLContext ctx;
  pointer pNVar7;
  NDArray NVar8;
  pointer pPVar9;
  TVMType TVar10;
  pointer pvVar11;
  ostream *poVar12;
  DLContext *pDVar13;
  long lVar14;
  Container *__tmp;
  pointer paVar15;
  long *plVar16;
  DLContext *pDVar17;
  long lVar18;
  pointer plVar19;
  DLContext *pDVar20;
  uint uVar21;
  ulong uVar22;
  pointer pbVar23;
  ulong uVar24;
  ulong uVar25;
  pointer pPVar26;
  LogCheckError _check_err;
  vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  pool_entry;
  vector<DLDataType,_std::allocator<DLDataType>_> vtype;
  vector<long,_std::allocator<long>_> shape;
  NDArray local_268;
  vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_> *local_260;
  vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  local_258;
  ulong local_240;
  vector<DLDataType,_std::allocator<DLDataType>_> local_238;
  GraphRuntime *local_218;
  vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_> *local_210;
  string local_208;
  vector<long,_std::allocator<long>_> local_1e8;
  vector<long,_std::allocator<long>_> local_1d0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar23 = (this->attrs_).dltype.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->attrs_).dltype.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar23 != pbVar3) {
    do {
      pcVar4 = (pbVar23->_M_dataplus)._M_p;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,pcVar4,pcVar4 + pbVar23->_M_string_length);
      TVar10 = String2TVMType(&local_208);
      local_1b8._0_4_ = TVar10;
      std::vector<DLDataType,_std::allocator<DLDataType>_>::emplace_back<DLDataType>
                (&local_238,(anon_struct_4_3_3efc03b1 *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar3);
  }
  local_258.
  super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar11 = (this->attrs_).shape.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->attrs_).shape.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar11) {
    uVar24 = 0;
    do {
      piVar5 = (this->attrs_).device_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar5 == (this->attrs_).device_index.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        paVar15 = (this->ctxs_).super__Vector_base<DLContext,_std::allocator<DLContext>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        paVar15 = (pointer)(piVar5 + uVar24);
      }
      lVar18 = 1;
      for (plVar16 = pvVar11[uVar24].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          plVar16 !=
          pvVar11[uVar24].super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish; plVar16 = plVar16 + 1) {
        lVar18 = lVar18 * *plVar16;
      }
      uVar1 = (this->attrs_).storage_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar24];
      uVar25 = (ulong)uVar1;
      local_260 = (vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_> *)
                  CONCAT44(local_260._4_4_,paVar15->device_type);
      local_1b8._0_4_ = uVar1;
      local_240 = local_240 & 0xffffffff00000000;
      dmlc::LogCheck_GE<int,int>((dmlc *)&local_268,(int *)local_1b8,(int *)&local_240);
      if (local_268.data_ != (Container *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                   ,0x100);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"Check failed: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"storage_id >= 0",0xf);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b8,(char *)((local_268.data_)->dl_tensor).data,
                             (long)((local_268.data_)->dl_tensor).ctx);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"Do not support runtime shape op",0x1f);
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
      }
      dmlc::LogCheckError::~LogCheckError((LogCheckError *)&local_268);
      uVar21 = (uint)local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24].lanes *
               (uint)local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24].bits;
      if (uVar21 != 1 && (uVar21 & 7) != 0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                   ,0x103);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"Check failed: bits % 8U == 0U || bits == 1U",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,": ",2);
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
      }
      if (uVar25 < (ulong)((long)local_258.
                                 super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_258.
                                 super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        if ((local_258.
             super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].device_type != -1) &&
           (local_258.
            super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar25].device_type != (int)local_260)) {
          dmlc::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                     ,0x10b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "Check failed: pool_entry[sid].device_type == -1 || pool_entry[sid].device_type == device_type"
                     ,0x5d);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "The same pool entry cannot be assigned to multiple devices",0x3a);
          dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
        }
      }
      else {
        local_1b8._0_8_ = (Container *)0x0;
        local_1b8._8_4_ = 0xffffffff;
        std::
        vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
        ::resize(&local_258,(ulong)(uVar1 + 1),(value_type *)local_1b8);
      }
      uVar22 = (ulong)(uVar21 + 7 >> 3) * lVar18;
      if (uVar22 < local_258.
                   super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar25].size) {
        uVar22 = local_258.
                 super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25].size;
      }
      local_258.
      super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar25].size = uVar22;
      local_258.
      super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar25].device_type = (int)local_260;
      uVar24 = uVar24 + 1;
      pvVar11 = (this->attrs_).shape.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)(((long)(this->attrs_).shape.
                                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 3
                              ) * -0x5555555555555555));
  }
  pPVar9 = local_258.
           super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258.
      super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_260 = &this->storage_pool_;
    pPVar26 = local_258.
              super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1b8._0_8_ = (Container *)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      pDVar13 = (DLContext *)
                (this->ctxs_).super__Vector_base<DLContext,_std::allocator<DLContext>_>._M_impl.
                super__Vector_impl_data._M_start;
      pDVar6 = (DLContext *)
               (this->ctxs_).super__Vector_base<DLContext,_std::allocator<DLContext>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar18 = (long)pDVar6 - (long)pDVar13 >> 5;
      pDVar17 = pDVar13;
      if (0 < lVar18) {
        DVar2 = pPVar26->device_type;
        pDVar17 = (DLContext *)
                  ((long)&pDVar13->device_type +
                  ((long)pDVar6 - (long)pDVar13 & 0xffffffffffffffe0U));
        lVar18 = lVar18 + 1;
        pDVar20 = pDVar13 + 2;
        do {
          if (DVar2 == pDVar20[-2].device_type) {
            pDVar20 = pDVar20 + -2;
            goto LAB_0010f668;
          }
          if (DVar2 == pDVar20[-1].device_type) {
            pDVar20 = pDVar20 + -1;
            goto LAB_0010f668;
          }
          if (DVar2 == pDVar20->device_type) goto LAB_0010f668;
          if (DVar2 == pDVar20[1].device_type) {
            pDVar20 = pDVar20 + 1;
            goto LAB_0010f668;
          }
          lVar18 = lVar18 + -1;
          pDVar20 = pDVar20 + 4;
        } while (1 < lVar18);
      }
      lVar18 = (long)pDVar6 - (long)pDVar17 >> 3;
      if (lVar18 == 1) {
LAB_0010f649:
        pDVar20 = pDVar17;
        if (pPVar26->device_type != pDVar17->device_type) {
          pDVar20 = pDVar6;
        }
      }
      else if (lVar18 == 2) {
LAB_0010f63d:
        pDVar20 = pDVar17;
        if (pPVar26->device_type != pDVar17->device_type) {
          pDVar17 = pDVar17 + 1;
          goto LAB_0010f649;
        }
      }
      else {
        pDVar20 = pDVar6;
        if ((lVar18 == 3) && (pDVar20 = pDVar17, pPVar26->device_type != pDVar17->device_type)) {
          pDVar17 = pDVar17 + 1;
          goto LAB_0010f63d;
        }
      }
LAB_0010f668:
      if (pDVar20 != pDVar6) {
        pDVar13 = pDVar20;
      }
      ctx = *pDVar13;
      lVar18 = pPVar26->size + 3;
      lVar14 = pPVar26->size + 6;
      if (-1 < lVar18) {
        lVar14 = lVar18;
      }
      local_268.data_ = (Container *)(lVar14 >> 2);
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                ((vector<long,_std::allocator<long>_> *)local_1b8,(iterator)0x0,(long *)&local_268);
      std::vector<long,_std::allocator<long>_>::vector
                (&local_1d0,(vector<long,_std::allocator<long>_> *)local_1b8);
      NDArray::Empty(&local_268,&local_1d0,(DLDataType)0x12002,ctx);
      std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::
      emplace_back<tvm::runtime::NDArray>(local_260,&local_268);
      NDArray::~NDArray(&local_268);
      if (local_1d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((Container *)local_1b8._0_8_ != (Container *)0x0) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
      }
      pPVar26 = pPVar26 + 1;
    } while (pPVar26 != pPVar9);
  }
  local_210 = &this->data_entry_;
  std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::resize
            (local_210,
             (ulong)(this->node_row_ptr_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1]);
  if ((this->data_entry_).
      super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->data_entry_).
      super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_260 = (vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_> *)0x0;
    uVar24 = 0;
    local_218 = this;
    do {
      plVar19 = (pointer)(long)(local_218->attrs_).storage_id.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar24];
      local_240 = (long)(local_218->storage_pool_).
                        super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_218->storage_pool_).
                        super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
      local_1b8._0_8_ = plVar19;
      dmlc::LogCheck_LT<unsigned_long,unsigned_long>
                ((dmlc *)&local_268,(unsigned_long *)local_1b8,&local_240);
      if (local_268.data_ != (Container *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                   ,0x127);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"Check failed: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"static_cast<size_t>(storage_id) < storage_pool_.size()",
                   0x36);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b8,(char *)((local_268.data_)->dl_tensor).data,
                             (long)((local_268.data_)->dl_tensor).ctx);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
      }
      dmlc::LogCheckError::~LogCheckError((LogCheckError *)&local_268);
      pNVar7 = (local_218->storage_pool_).
               super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<long,_std::allocator<long>_>::vector
                (&local_1e8,
                 (vector<long,_std::allocator<long>_> *)
                 ((long)&(local_260->
                         super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                 (long)(local_218->attrs_).shape.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
      NDArray::CreateView(&local_268,(vector<long,_std::allocator<long>_> *)(pNVar7 + (long)plVar19)
                          ,SUB84(&local_1e8,0));
      NVar8.data_ = local_268.data_;
      pNVar7 = (local_210->
               super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_268.data_ = (Container *)0x0;
      local_1b8._0_8_ = pNVar7[uVar24].data_;
      pNVar7[uVar24].data_ = NVar8.data_;
      NDArray::~NDArray((NDArray *)local_1b8);
      NDArray::~NDArray(&local_268);
      if (local_1e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar24 = uVar24 + 1;
      local_260 = local_260 + 1;
    } while (uVar24 < (ulong)((long)(local_218->data_entry_).
                                    super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_218->data_entry_).
                                    super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_258.
      super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GraphRuntime::SetupStorage() {
  // Grab saved optimization plan from graph.
  std::vector<TVMType> vtype;
  for (const std::string &s_type : attrs_.dltype) {
    vtype.push_back(tvm::runtime::String2TVMType(s_type));
  }

  // Size and device type of each storage pool entry.
  std::vector<PoolEntry> pool_entry;
  // Find the maximum space size.
  for (size_t i = 0; i < attrs_.shape.size(); ++i) {
    int storage_id = attrs_.storage_id[i];
    // Use the fallback device if no device index is available.
    int device_type = static_cast<int>(ctxs_[0].device_type);
    if (!attrs_.device_index.empty()) {
      device_type = attrs_.device_index[i];
    }
    size_t size = 1;
    for (int64_t sz : attrs_.shape[i]) {
      size *= static_cast<size_t>(sz);
    }
    CHECK_GE(storage_id, 0) << "Do not support runtime shape op";
    DLDataType t = vtype[i];
    size_t bits = t.bits * t.lanes;
    CHECK(bits % 8U == 0U || bits == 1U);
    size_t bytes = ((bits + 7U) / 8U) * size;

    uint32_t sid = static_cast<uint32_t>(storage_id);
    if (sid >= pool_entry.size()) {
      pool_entry.resize(sid + 1, {0, -1});
    } else {
      CHECK(pool_entry[sid].device_type == -1 ||
            pool_entry[sid].device_type == device_type)
          << "The same pool entry cannot be assigned to multiple devices";
    }
    pool_entry[sid].size = std::max(pool_entry[sid].size, bytes);
    pool_entry[sid].device_type = device_type;
  }

  // Allocate the space.
  for (const auto &pit : pool_entry) {
    std::vector<int64_t> shape;
    // This for loop is very fast since there are usually only a couple of
    // devices available on the same hardware.
    const auto &cit =
        std::find_if(ctxs_.begin(), ctxs_.end(), [&pit](const TVMContext &c) {
          return pit.device_type == static_cast<int>(c.device_type);
        });
    TVMContext ctx = cit == ctxs_.end() ? ctxs_[0] : *cit;
    shape.push_back(static_cast<int64_t>(pit.size + 3) / 4);
    storage_pool_.push_back(
        NDArray::Empty(shape, DLDataType{kDLFloat, 32, 1}, ctx));
  }

  // Assign the pooled entries. A unified memory pool is used to simplifiy
  // memory assignment for each node entry. The allocated memory on each device
  // is mapped to this pool.
  data_entry_.resize(num_node_entries());
  for (size_t i = 0; i < data_entry_.size(); ++i) {
    int storage_id = attrs_.storage_id[i];
    CHECK_LT(static_cast<size_t>(storage_id), storage_pool_.size());
    data_entry_[i] =
        storage_pool_[storage_id].CreateView(attrs_.shape[i], vtype[i]);
  }
}